

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O0

void __thiscall sf::VertexBuffer::VertexBuffer(VertexBuffer *this,Usage usage)

{
  undefined4 in_ESI;
  Drawable *in_RDI;
  
  Drawable::Drawable(in_RDI);
  GlResource::GlResource((GlResource *)0x2b2ab4);
  in_RDI->_vptr_Drawable = (_func_int **)&PTR__VertexBuffer_00493938;
  *(undefined4 *)&in_RDI[1]._vptr_Drawable = 0;
  in_RDI[2]._vptr_Drawable = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[3]._vptr_Drawable = 0;
  *(undefined4 *)((long)&in_RDI[3]._vptr_Drawable + 4) = in_ESI;
  return;
}

Assistant:

VertexBuffer::VertexBuffer(VertexBuffer::Usage usage) :
m_buffer       (0),
m_size         (0),
m_primitiveType(Points),
m_usage        (usage)
{
}